

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t archive_mstring_get_wcs(archive *a,archive_mstring *aes,wchar_t **wp)

{
  wchar_t wVar1;
  char *local_38;
  char *p;
  wchar_t ret;
  wchar_t r;
  wchar_t **wp_local;
  archive_mstring *aes_local;
  archive *a_local;
  
  p._0_4_ = L'\0';
  if ((aes->aes_set & 4U) == 0) {
    *wp = (wchar_t *)0x0;
    _ret = wp;
    wp_local = (wchar_t **)aes;
    aes_local = (archive_mstring *)a;
    if ((aes->aes_set & 1U) == 0) {
      archive_mstring_get_mbs(a,aes,&local_38);
    }
    if (((ulong)wp_local[0xc] & 1) != 0) {
      wp_local[7] = (wchar_t *)0x0;
      wVar1 = archive_wstring_append_from_mbs
                        ((archive_wstring *)(wp_local + 6),(char *)*wp_local,(size_t)wp_local[1]);
      if (wVar1 == L'\0') {
        *(uint *)(wp_local + 0xc) = *(uint *)(wp_local + 0xc) | 4;
        *_ret = wp_local[6];
      }
      else {
        p._0_4_ = L'\xffffffff';
      }
    }
    a_local._4_4_ = (wchar_t)p;
  }
  else {
    *wp = (aes->aes_wcs).s;
    a_local._4_4_ = L'\0';
  }
  return a_local._4_4_;
}

Assistant:

int
archive_mstring_get_wcs(struct archive *a, struct archive_mstring *aes,
    const wchar_t **wp)
{
	int r, ret = 0;

	(void)a;/* UNUSED */
	/* Return WCS form if we already have it. */
	if (aes->aes_set & AES_SET_WCS) {
		*wp = aes->aes_wcs.s;
		return (ret);
	}

	*wp = NULL;
#if defined(_WIN32) && !defined(__CYGWIN__)
	/*
	 * On Windows, prefer converting from UTF-8 directly to WCS because:
	 * (1) there's no guarantee that the string can be represented in MBS (e.g.
	 * with CP_ACP), and (2) in order to convert from UTF-8 to MBS, we're going
	 * to need to convert from UTF-8 to WCS anyway and its wasteful to throw
	 * away that intermediate result
	 */
	if (aes->aes_set & AES_SET_UTF8) {
		struct archive_string_conv *sc;

		sc = archive_string_conversion_from_charset(a, "UTF-8", 1);
		if (sc != NULL) {
			archive_wstring_empty((&aes->aes_wcs));
			r = archive_wstring_append_from_mbs_in_codepage(&(aes->aes_wcs),
			    aes->aes_utf8.s, aes->aes_utf8.length, sc);
			if (a == NULL)
				free_sconv_object(sc);
			if (r == 0) {
				aes->aes_set |= AES_SET_WCS;
				*wp = aes->aes_wcs.s;
				return (0);
			}
		}
	}
#endif
	/* Try converting UTF8 to MBS first if MBS does not exist yet. */
	if ((aes->aes_set & AES_SET_MBS) == 0) {
		const char *p; /* unused */
		archive_mstring_get_mbs(a, aes, &p); /* ignore errors, we'll handle it later */
	}
	/* Try converting MBS to WCS using native locale. */
	if (aes->aes_set & AES_SET_MBS) {
		archive_wstring_empty(&(aes->aes_wcs));
		r = archive_wstring_append_from_mbs(&(aes->aes_wcs),
		    aes->aes_mbs.s, aes->aes_mbs.length);
		if (r == 0) {
			aes->aes_set |= AES_SET_WCS;
			*wp = aes->aes_wcs.s;
		} else
			ret = -1;/* failure. */
	}
	return (ret);
}